

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

void address_space_set_flatview(AddressSpace *as)

{
  FlatView *view;
  MemoryRegion_conflict *key;
  FlatView *new_view;
  FlatView *old_view;
  FlatView tmpview;
  
  view = as->current_map;
  key = memory_region_get_flatview_root(as->root);
  new_view = (FlatView *)g_hash_table_lookup(as->uc->flat_views,key);
  if (new_view == (FlatView *)0x0) {
    __assert_fail("new_view",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/softmmu/memory.c"
                  ,0x3a9,"void address_space_set_flatview(AddressSpace *)");
  }
  if (view != new_view) {
    new_view->ref = new_view->ref + 1;
    if ((as->listeners).tqh_first != (MemoryListener *)0x0) {
      tmpview.nr = 0;
      tmpview.nr_allocated = 0;
      tmpview.dispatch = (AddressSpaceDispatch *)0x0;
      tmpview.root = (MemoryRegion *)0x0;
      tmpview.ref = 0;
      tmpview._4_4_ = 0;
      tmpview.ranges = (FlatRange *)0x0;
      old_view = &tmpview;
      if (view != (FlatView *)0x0) {
        old_view = view;
      }
      address_space_update_topology_pass(as,old_view,new_view,false);
      address_space_update_topology_pass(as,old_view,new_view,true);
    }
    as->current_map = new_view;
    if (view != (FlatView *)0x0) {
      flatview_unref_tricore(view);
      return;
    }
  }
  return;
}

Assistant:

static void address_space_set_flatview(AddressSpace *as)
{
    FlatView *old_view = address_space_to_flatview(as);
    MemoryRegion *physmr = memory_region_get_flatview_root(as->root);
    FlatView *new_view = g_hash_table_lookup(as->uc->flat_views, physmr);

    assert(new_view);

    if (old_view == new_view) {
        return;
    }

    flatview_ref(new_view);
    if (!QTAILQ_EMPTY(&as->listeners)) {
        FlatView tmpview = { .nr = 0 }, *old_view2 = old_view;

        if (!old_view2) {
            old_view2 = &tmpview;
        }
        address_space_update_topology_pass(as, old_view2, new_view, false);
        address_space_update_topology_pass(as, old_view2, new_view, true);
    }

    as->current_map = new_view;
    if (old_view) {
        flatview_unref(old_view);
    }
}